

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O2

void __thiscall Assimp::StreamWriter<false,_false>::Flush(StreamWriter<false,_false> *this)

{
  element_type *peVar1;
  pointer puVar2;
  
  peVar1 = (this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar2 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*peVar1->_vptr_IOStream[3])
            (peVar1,puVar2,1,
             (long)(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
  (*((this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_IOStream[7])();
  puVar2 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  this->cursor = 0;
  return;
}

Assistant:

void Flush()
    {
        stream->Write(buffer.data(), 1, buffer.size());
        stream->Flush();
        buffer.clear();
        cursor = 0;
    }